

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O3

bool embree::sse2::InstanceIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  Instance *pIVar1;
  RTCRayQueryContext *pRVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float *pfVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  bool bVar28;
  RayQueryContext newcontext;
  
  pIVar1 = prim->instance;
  if (((ray->mask & (pIVar1->super_Geometry).mask) == 0) ||
     (pRVar2 = context->user, pRVar2->instID[0] != 0xffffffff)) {
    bVar28 = false;
  }
  else {
    pRVar2->instID[0] = prim->instID_;
    pRVar2->instPrimID[0] = 0;
    fVar4 = (pIVar1->world2local0).l.vx.field_0.m128[0];
    fVar5 = (pIVar1->world2local0).l.vx.field_0.m128[1];
    fVar6 = (pIVar1->world2local0).l.vx.field_0.m128[2];
    fVar7 = (pIVar1->world2local0).l.vy.field_0.m128[0];
    fVar8 = (pIVar1->world2local0).l.vy.field_0.m128[1];
    fVar9 = (pIVar1->world2local0).l.vy.field_0.m128[2];
    fVar10 = (pIVar1->world2local0).l.vz.field_0.m128[0];
    fVar11 = (pIVar1->world2local0).l.vz.field_0.m128[1];
    fVar12 = (pIVar1->world2local0).l.vz.field_0.m128[2];
    fVar13 = (ray->org).field_0.m128[0];
    fVar14 = (ray->org).field_0.m128[1];
    uVar24 = *(undefined8 *)&(ray->org).field_0;
    pfVar16 = (ray->org).field_0.m128 + 2;
    fVar15 = *pfVar16;
    fVar17 = (ray->org).field_0.m128[3];
    uVar25 = *(undefined8 *)pfVar16;
    fVar18 = (ray->dir).field_0.m128[0];
    fVar19 = (ray->dir).field_0.m128[1];
    uVar26 = *(undefined8 *)&(ray->dir).field_0;
    pfVar16 = (ray->dir).field_0.m128 + 2;
    fVar20 = *pfVar16;
    fVar21 = (ray->dir).field_0.m128[3];
    uVar27 = *(undefined8 *)pfVar16;
    fVar22 = (pIVar1->world2local0).p.field_0.m128[1];
    fVar23 = (pIVar1->world2local0).p.field_0.m128[2];
    (ray->org).field_0.m128[0] =
         fVar13 * fVar4 +
         fVar14 * fVar7 + fVar15 * fVar10 + (pIVar1->world2local0).p.field_0.m128[0];
    (ray->org).field_0.m128[1] = fVar13 * fVar5 + fVar14 * fVar8 + fVar15 * fVar11 + fVar22;
    (ray->org).field_0.m128[2] = fVar13 * fVar6 + fVar14 * fVar9 + fVar15 * fVar12 + fVar23;
    (ray->org).field_0.m128[3] = fVar17;
    (ray->dir).field_0.m128[0] = fVar18 * fVar4 + fVar19 * fVar7 + fVar20 * fVar10;
    (ray->dir).field_0.m128[1] = fVar18 * fVar5 + fVar19 * fVar8 + fVar20 * fVar11;
    (ray->dir).field_0.m128[2] = fVar18 * fVar6 + fVar19 * fVar9 + fVar20 * fVar12;
    (ray->dir).field_0.m128[3] = fVar21;
    lVar3 = *(long *)&(pIVar1->super_Geometry).field_0x58;
    (**(code **)(lVar3 + 0x80))(lVar3 + 0x58,ray);
    *(undefined8 *)&(ray->org).field_0 = uVar24;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uVar25;
    *(undefined8 *)&(ray->dir).field_0 = uVar26;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uVar27;
    bVar28 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar2->instID[0] = 0xffffffff;
    pRVar2->instPrimID[0] = 0xffffffff;
  }
  return bVar28;
}

Assistant:

bool InstanceIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local();
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }